

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O0

Instr * __thiscall LowererMD::Simd128LowerLdLane(LowererMD *this,Instr *instr)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  IRType IVar4;
  Opnd *this_00;
  Instr *pIVar5;
  Opnd *pOVar6;
  undefined4 *puVar7;
  IntConstOpnd *pIVar8;
  RegOpnd *pRVar9;
  Opnd *local_c0;
  Instr *prevInstr;
  RegOpnd *tmp_2;
  Instr *pInstr;
  RegOpnd *tmp_1;
  Instr *newInstr;
  Instr *shiftInstr;
  Opnd *tmp;
  uint uStack_40;
  IRType laneType;
  uint mask;
  uint shamt;
  uint laneIndex;
  uint laneWidth;
  OpCode movOpcode;
  Opnd *src2;
  Opnd *src1;
  Opnd *dst;
  Instr *instr_local;
  LowererMD *this_local;
  
  laneIndex._2_2_ = MOVSS;
  uStack_40 = 0;
  tmp._4_4_ = 0;
  tmp._3_1_ = TyInt32;
  this_00 = IR::Instr::GetDst(instr);
  pIVar5 = (Instr *)IR::Instr::GetSrc1(instr);
  pOVar6 = IR::Instr::GetSrc2(instr);
  if (((this_00 == (Opnd *)0x0) || (bVar3 = IR::Opnd::IsRegOpnd(this_00), !bVar3)) ||
     (((IVar4 = IR::Opnd::GetType(this_00), IVar4 != TyFloat32 &&
       (((IVar4 = IR::Opnd::GetType(this_00), IVar4 != TyInt32 &&
         (IVar4 = IR::Opnd::GetType(this_00), IVar4 != TyUint32)) &&
        (IVar4 = IR::Opnd::GetType(this_00), IVar4 != TyFloat64)))) &&
      (bVar3 = IR::Opnd::IsInt64(this_00), !bVar3)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x27f,
                       "(dst && dst->IsRegOpnd() && (dst->GetType() == TyFloat32 || dst->GetType() == TyInt32 || dst->GetType() == TyUint32 || dst->GetType() == TyFloat64 || dst->IsInt64()))"
                       ,
                       "dst && dst->IsRegOpnd() && (dst->GetType() == TyFloat32 || dst->GetType() == TyInt32 || dst->GetType() == TyUint32 || dst->GetType() == TyFloat64 || dst->IsInt64())"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (((pIVar5 == (Instr *)0x0) || (bVar3 = IR::Opnd::IsRegOpnd((Opnd *)pIVar5), !bVar3)) ||
     (bVar3 = IR::Opnd::IsSimd128((Opnd *)pIVar5), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x280,"(src1 && src1->IsRegOpnd() && src1->IsSimd128())",
                       "src1 && src1->IsRegOpnd() && src1->IsSimd128()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if ((pOVar6 == (Opnd *)0x0) || (bVar3 = IR::Opnd::IsIntConstOpnd(pOVar6), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x281,"(src2 && src2->IsIntConstOpnd())","src2 && src2->IsIntConstOpnd()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pIVar8 = IR::Opnd::AsIntConstOpnd(pOVar6);
  mask = IR::IntConstOpnd::AsUint32(pIVar8);
  shamt = 4;
  OVar1 = instr->m_opcode;
  if (OVar1 == Simd128_ExtractLane_I2) {
    shamt = 8;
    goto LAB_008a132f;
  }
  if (OVar1 == Simd128_ExtractLane_I16) goto LAB_008a11a7;
  if (OVar1 == Simd128_ExtractLane_I4) {
LAB_008a1245:
    laneIndex._2_2_ = MOVD;
    if (3 < mask) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x2a7,"(laneIndex < 4)","laneIndex < 4");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
  }
  else {
    if (OVar1 == Simd128_ExtractLane_F4) {
      laneIndex._2_2_ = MOVSS;
      if (3 < mask) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                           ,0x28d,"(laneIndex < 4)","laneIndex < 4");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      goto LAB_008a132f;
    }
    if (OVar1 != Simd128_ExtractLane_I8) {
      if (OVar1 == Simd128_ExtractLane_U4) goto LAB_008a1245;
      if (OVar1 != Simd128_ExtractLane_U8) {
        if (OVar1 != Simd128_ExtractLane_U16) {
          if (OVar1 == Simd128_ExtractLane_B4) goto LAB_008a1245;
          if (OVar1 == Simd128_ExtractLane_B8) goto LAB_008a110a;
          if (OVar1 != Simd128_ExtractLane_B16) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                               ,0x2aa,"((0))","UNREACHED");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
            goto LAB_008a132f;
          }
        }
LAB_008a11a7:
        laneIndex._2_2_ = MOVD;
        if (0xf < mask) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                             ,0x29d,"(laneIndex < 16)","laneIndex < 16");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        uStack_40 = (mask & 3) << 3;
        mask = mask >> 2;
        tmp._3_1_ = TyInt8;
        tmp._4_4_ = 0xff;
        goto LAB_008a132f;
      }
    }
LAB_008a110a:
    laneIndex._2_2_ = MOVD;
    if (7 < mask) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x293,"(laneIndex < 8)","laneIndex < 8");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    uStack_40 = (mask & 1) << 4;
    mask = mask >> 1;
    tmp._3_1_ = TyInt16;
    tmp._4_4_ = 0xffff;
  }
LAB_008a132f:
  if (shamt == 8) {
    pOVar6 = IR::Instr::GetSrc1(instr);
    EmitExtractInt64(this,this_00,pOVar6,mask,instr);
  }
  else {
    shiftInstr = pIVar5;
    if (mask != 0) {
      IVar4 = IR::Opnd::GetType((Opnd *)pIVar5);
      shiftInstr = (Instr *)IR::RegOpnd::New(IVar4,this->m_func);
      pIVar8 = IR::IntConstOpnd::New((ulong)(shamt * mask),TyInt8,this->m_func,true);
      pIVar5 = IR::Instr::New(PSRLDQ,(Opnd *)shiftInstr,(Opnd *)pIVar5,&pIVar8->super_Opnd,
                              this->m_func);
      IR::Instr::InsertBefore(instr,pIVar5);
      Legalize<false>(pIVar5,false);
    }
    local_c0 = this_00;
    if (laneIndex._2_2_ != MOVD) {
      IVar4 = IR::Opnd::GetType((Opnd *)shiftInstr);
      local_c0 = IR::Opnd::UseWithNewType(this_00,IVar4,this->m_func);
    }
    pIVar5 = IR::Instr::New(laneIndex._2_2_,local_c0,(Opnd *)shiftInstr,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar5);
  }
  if (((((instr->m_opcode == Simd128_ExtractLane_I8) || (instr->m_opcode == Simd128_ExtractLane_U8))
       || (instr->m_opcode == Simd128_ExtractLane_B8)) ||
      ((instr->m_opcode == Simd128_ExtractLane_U16 || (instr->m_opcode == Simd128_ExtractLane_I16)))
      ) || (instr->m_opcode == Simd128_ExtractLane_B16)) {
    if (uStack_40 != 0) {
      pIVar8 = IR::IntConstOpnd::New((ulong)uStack_40,TyInt8,this->m_func,false);
      pIVar5 = IR::Instr::New(SHR,this_00,this_00,&pIVar8->super_Opnd,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar5);
      Legalize<false>(pIVar5,false);
    }
    if ((tmp._3_1_ != TyInt8) && (tmp._3_1_ != TyInt16)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x2ce,"(laneType == TyInt8 || laneType == TyInt16)",
                         "laneType == TyInt8 || laneType == TyInt16");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    if ((instr->m_opcode == Simd128_ExtractLane_I8) || (instr->m_opcode == Simd128_ExtractLane_I16))
    {
      if (tmp._3_1_ == TyInt8) {
        pRVar9 = IR::RegOpnd::New(TyInt8,this->m_func);
        pIVar5 = IR::Instr::New(MOV,&pRVar9->super_Opnd,this_00,this->m_func);
        IR::Instr::InsertBefore(instr,pIVar5);
        Legalize<false>(pIVar5,false);
        tmp_1 = (RegOpnd *)IR::Instr::New(MOVSX,this_00,&pRVar9->super_Opnd,this->m_func);
      }
      else {
        pOVar6 = IR::Opnd::UseWithNewType(this_00,tmp._3_1_,this->m_func);
        tmp_1 = (RegOpnd *)IR::Instr::New(MOVSXW,this_00,pOVar6,this->m_func);
      }
    }
    else {
      pIVar8 = IR::IntConstOpnd::New((ulong)tmp._4_4_,TyInt32,this->m_func,false);
      tmp_1 = (RegOpnd *)IR::Instr::New(AND,this_00,this_00,&pIVar8->super_Opnd,this->m_func);
    }
    IR::Instr::InsertBefore(instr,(Instr *)tmp_1);
    Legalize<false>((Instr *)tmp_1,false);
  }
  if (((instr->m_opcode == Simd128_ExtractLane_B4) || (instr->m_opcode == Simd128_ExtractLane_B8))
     || (instr->m_opcode == Simd128_ExtractLane_B16)) {
    pRVar9 = IR::RegOpnd::New(TyInt8,this->m_func);
    pIVar5 = IR::Instr::New(CMP,this->m_func);
    pOVar6 = IR::Opnd::UseWithNewType(this_00,tmp._3_1_,this->m_func);
    IR::Instr::SetSrc1(pIVar5,pOVar6);
    pIVar8 = IR::IntConstOpnd::New(0,tmp._3_1_,this->m_func,true);
    IR::Instr::SetSrc2(pIVar5,&pIVar8->super_Opnd);
    IR::Instr::InsertBefore(instr,pIVar5);
    Legalize<false>(pIVar5,false);
    pIVar5 = IR::Instr::New(MOV,&pRVar9->super_Opnd,this_00,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar5);
    Legalize<false>(pIVar5,false);
    pIVar5 = IR::Instr::New(SETNE,&pRVar9->super_Opnd,&pRVar9->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar5);
    Legalize<false>(pIVar5,false);
    pIVar5 = IR::Instr::New(MOVSX,this_00,&pRVar9->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar5);
  }
  pIVar5 = instr->m_prev;
  IR::Instr::Remove(instr);
  return pIVar5;
}

Assistant:

IR::Instr* LowererMD::Simd128LowerLdLane(IR::Instr *instr)
{
    IR::Opnd* dst, *src1, *src2;
    Js::OpCode movOpcode = Js::OpCode::MOVSS;
    uint laneWidth = 0, laneIndex = 0, shamt = 0, mask = 0;
    IRType laneType = TyInt32;
    dst = instr->GetDst();
    src1 = instr->GetSrc1();
    src2 = instr->GetSrc2();

    Assert(dst && dst->IsRegOpnd() && (dst->GetType() == TyFloat32 || dst->GetType() == TyInt32 || dst->GetType() == TyUint32 || dst->GetType() == TyFloat64 || dst->IsInt64()));
    Assert(src1 && src1->IsRegOpnd() && src1->IsSimd128());
    Assert(src2 && src2->IsIntConstOpnd());


    laneIndex = (uint)src2->AsIntConstOpnd()->AsUint32();
    laneWidth = 4;
    switch (instr->m_opcode)
    {
    case Js::OpCode::Simd128_ExtractLane_I2:
        laneWidth = 8;
        break;
    case Js::OpCode::Simd128_ExtractLane_F4:
        movOpcode = Js::OpCode::MOVSS;
        Assert(laneIndex < 4);
        break;
    case Js::OpCode::Simd128_ExtractLane_I8:
    case Js::OpCode::Simd128_ExtractLane_U8:
    case Js::OpCode::Simd128_ExtractLane_B8:
        movOpcode = Js::OpCode::MOVD;
        Assert(laneIndex < 8);
        shamt = (laneIndex % 2) * 16;
        laneIndex = laneIndex / 2;
        laneType = TyInt16;
        mask = 0x0000ffff;
        break;
    case Js::OpCode::Simd128_ExtractLane_I16:
    case Js::OpCode::Simd128_ExtractLane_U16:
    case Js::OpCode::Simd128_ExtractLane_B16:
        movOpcode = Js::OpCode::MOVD;
        Assert(laneIndex < 16);
        shamt = (laneIndex % 4) * 8;
        laneIndex = laneIndex / 4;
        laneType = TyInt8;
        mask = 0x000000ff;
        break;
    case Js::OpCode::Simd128_ExtractLane_U4:
    case Js::OpCode::Simd128_ExtractLane_I4:
    case Js::OpCode::Simd128_ExtractLane_B4:
        movOpcode = Js::OpCode::MOVD;
        Assert(laneIndex < 4);
        break;
    default:
        Assert(UNREACHED);
    }

    if (laneWidth == 8) //Simd128_ExtractLane_I2
    {
        EmitExtractInt64(dst, instr->GetSrc1(), laneIndex, instr);
    }
    else
    {
        IR::Opnd* tmp = src1;
        if (laneIndex != 0)
        {
            // tmp = PSRLDQ src1, shamt
            tmp = IR::RegOpnd::New(src1->GetType(), m_func);
            IR::Instr *shiftInstr = IR::Instr::New(Js::OpCode::PSRLDQ, tmp, src1, IR::IntConstOpnd::New(laneWidth * laneIndex, TyInt8, m_func, true), m_func);
            instr->InsertBefore(shiftInstr);
            Legalize(shiftInstr);
        }
        // MOVSS/MOVSD/MOVD dst, tmp
        instr->InsertBefore(IR::Instr::New(movOpcode, movOpcode == Js::OpCode::MOVD ? dst : dst->UseWithNewType(tmp->GetType(), m_func), tmp, m_func));
    }

    // dst has the 4-byte lane
    if (instr->m_opcode == Js::OpCode::Simd128_ExtractLane_I8 || instr->m_opcode == Js::OpCode::Simd128_ExtractLane_U8 || instr->m_opcode == Js::OpCode::Simd128_ExtractLane_B8 ||
        instr->m_opcode == Js::OpCode::Simd128_ExtractLane_U16 || instr->m_opcode == Js::OpCode::Simd128_ExtractLane_I16 || instr->m_opcode == Js::OpCode::Simd128_ExtractLane_B16)
    {
        // extract the 1/2 bytes sublane
        IR::Instr *newInstr = nullptr;
        if (shamt != 0)
        {
            // SHR dst, dst, shamt
            newInstr = IR::Instr::New(Js::OpCode::SHR, dst, dst, IR::IntConstOpnd::New((IntConstType)shamt, TyInt8, m_func), m_func);
            instr->InsertBefore(newInstr);
            Legalize(newInstr);
        }

        Assert(laneType == TyInt8 || laneType == TyInt16);
        // zero or sign-extend upper bits
        if (instr->m_opcode == Js::OpCode::Simd128_ExtractLane_I8 || instr->m_opcode == Js::OpCode::Simd128_ExtractLane_I16)
        {
            if (laneType == TyInt8)
            {
                IR::RegOpnd * tmp = IR::RegOpnd::New(TyInt8, m_func);
                newInstr = IR::Instr::New(Js::OpCode::MOV, tmp, dst, m_func);
                instr->InsertBefore(newInstr);
                Legalize(newInstr);
                newInstr = IR::Instr::New(Js::OpCode::MOVSX, dst, tmp, m_func);
            }
            else
            {
                newInstr = IR::Instr::New(Js::OpCode::MOVSXW, dst, dst->UseWithNewType(laneType, m_func), m_func);
            }
        }
        else
        {
            newInstr = IR::Instr::New(Js::OpCode::AND, dst, dst, IR::IntConstOpnd::New(mask, TyInt32, m_func), m_func);
        }

        instr->InsertBefore(newInstr);
        Legalize(newInstr);
    }
    if (instr->m_opcode == Js::OpCode::Simd128_ExtractLane_B4 || instr->m_opcode == Js::OpCode::Simd128_ExtractLane_B8 ||
        instr->m_opcode == Js::OpCode::Simd128_ExtractLane_B16)
    {
        IR::Instr* pInstr = nullptr;
        IR::RegOpnd* tmp = IR::RegOpnd::New(TyInt8, m_func);

        // cmp      dst, 0
        pInstr = IR::Instr::New(Js::OpCode::CMP, m_func);
        pInstr->SetSrc1(dst->UseWithNewType(laneType, m_func));
        pInstr->SetSrc2(IR::IntConstOpnd::New(0, laneType, m_func, true));
        instr->InsertBefore(pInstr);
        Legalize(pInstr);

        // mov     tmp(TyInt8), dst
        pInstr = IR::Instr::New(Js::OpCode::MOV, tmp, dst, m_func);
        instr->InsertBefore(pInstr);
        Legalize(pInstr);

        // setne     tmp(TyInt8)
        pInstr = IR::Instr::New(Js::OpCode::SETNE, tmp, tmp, m_func);
        instr->InsertBefore(pInstr);
        Legalize(pInstr);

        // movsx      dst, tmp(TyInt8)
        instr->InsertBefore(IR::Instr::New(Js::OpCode::MOVSX, dst, tmp, m_func));
    }

    IR::Instr* prevInstr = instr->m_prev;
    instr->Remove();
    return prevInstr;
}